

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureState.h
# Opt level: O2

void __thiscall
async_simple::FutureState<std::error_code>::setResult
          (FutureState<std::error_code> *this,Try<std::error_code> *value)

{
  State SVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined7 uStack_18;
  State state;
  
  _uStack_18 = in_RAX;
  logicAssert(((this->_state)._M_i & (DONE|ONLY_RESULT)) == START,"FutureState already has a result"
             );
  std::__detail::__variant::
  _Move_assign_base<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>::
  operator=((_Move_assign_base<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             *)&this->_try_value,
            (_Move_assign_base<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
             *)value);
  SVar1 = (this->_state)._M_i;
  _uStack_18 = CONCAT17(SVar1,uStack_18);
  if (SVar1 != ONLY_CONTINUATION) {
    if (SVar1 != START) goto LAB_0014e6cd;
    bVar2 = std::atomic<async_simple::detail::State>::compare_exchange_strong
                      (&this->_state,&state,ONLY_RESULT,release);
    if (bVar2) {
      return;
    }
  }
  bVar2 = std::atomic<async_simple::detail::State>::compare_exchange_strong
                    (&this->_state,&state,DONE,release);
  if (bVar2) {
    scheduleContinuation(this,false);
    return;
  }
LAB_0014e6cd:
  logicAssert(false,"State Transfer Error");
  return;
}

Assistant:

void setResult(Try<T>&& value) {
#if !defined(__GNUC__) || __GNUC__ < 12
        // GCC 12 issues a spurious uninitialized-var warning.
        // See details: https://gcc.gnu.org/bugzilla/show_bug.cgi?id=109448
        logicAssert(!hasResult(), "FutureState already has a result");
#endif
        _try_value = std::move(value);

        auto state = _state.load(std::memory_order_acquire);
        switch (state) {
            case detail::State::START:
                if (_state.compare_exchange_strong(state,
                                                   detail::State::ONLY_RESULT,
                                                   std::memory_order_release)) {
                    return;
                }
                // state has already transfered, fallthrough
                assert(_state.load(std::memory_order_relaxed) ==
                       detail::State::ONLY_CONTINUATION);
            case detail::State::ONLY_CONTINUATION:
                if (_state.compare_exchange_strong(state, detail::State::DONE,
                                                   std::memory_order_release)) {
                    scheduleContinuation(false);
                    return;
                }
            default:
                logicAssert(false, "State Transfer Error");
        }
    }